

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall customCountUnits_uniqueness_Test::TestBody(customCountUnits_uniqueness_Test *this)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  unit_data uVar4;
  uint uVar5;
  char *pcVar6;
  char *in_R9;
  int iVar7;
  ulong uVar8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  precise_unit cunit2;
  precise_unit cunit1;
  precise_unit cunit1inv;
  unsigned_short local_aa;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  AssertHelper local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  precise_unit local_70;
  AssertHelper local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  precise_unit local_50;
  precise_unit local_40;
  
  local_aa = 0;
  uVar5 = 0;
  do {
    uVar3 = ((uVar5 & 7) << 0x18 | 0xc00) << 4 | 0x50000;
    uVar3 = (uVar3 >> 2 & 0x10013000) + (uVar3 & 0x30010000) * 4;
    local_50._8_8_ =
         ZEXT48((uVar3 >> 1 & 0x40001000) + (uVar3 & 0x50051000) * 2 >> 1 |
                (int)(uVar5 << 0x1c) >> 0x11 & 0xc000U);
    local_50.multiplier_ = 1.0;
    local_40.base_units_ = units::detail::unit_data::inv(&local_50.base_units_);
    uVar5 = ~local_50.commodity_;
    if (local_50.commodity_ == 0) {
      uVar5 = 0;
    }
    local_40.commodity_ = uVar5;
    local_40.multiplier_ = 1.0;
    uVar1 = local_50.base_units_._2_2_;
    local_70.multiplier_ =
         (double)CONCAT62(local_70.multiplier_._2_6_,
                          (uVar1 >> 10 & 4 | uVar1 >> 0xc & 2 | uVar1 >> 0xe & 1) +
                          (ushort)((local_50._8_8_ & 0xc000) != 0) * 8);
    testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
              ((internal *)local_90,"precise::custom::custom_count_unit_number(cunit1.base_units())"
               ,"ii",(unsigned_short *)&local_70,&local_aa);
    if (local_90[0] == '\0') {
      testing::Message::Message((Message *)&local_70);
      pcVar6 = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x47d,pcVar6);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((long *)local_70.multiplier_ != (long *)0x0) {
        (**(code **)(*(long *)local_70.multiplier_ + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    uVar1 = local_50.base_units_._2_2_;
    local_70.multiplier_ =
         (double)CONCAT62(local_70.multiplier_._2_6_,
                          (uVar1 >> 10 & 4 | uVar1 >> 0xc & 2 | uVar1 >> 0xe & 1) +
                          (ushort)((local_50._8_8_ & 0xc000) != 0) * 8);
    testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
              ((internal *)local_90,"precise::custom::custom_count_unit_number(cunit1.base_units())"
               ,"ii",(unsigned_short *)&local_70,&local_aa);
    if (local_90[0] == '\0') {
      testing::Message::Message((Message *)&local_70);
      pcVar6 = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x47f,pcVar6);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((long *)local_70.multiplier_ != (long *)0x0) {
        (**(code **)(*(long *)local_70.multiplier_ + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    iVar7 = 0;
    uVar8 = 0;
    do {
      if (uVar8 != local_aa) {
        uVar5 = (((uint)uVar8 & 7) << 0x18 | 0xc00) << 4 | 0x50000;
        uVar5 = (uVar5 >> 2 & 0x10013000) + (uVar5 & 0x30010000) * 4;
        local_70._8_8_ =
             ZEXT48((uVar5 >> 1 & 0x40001000) + (uVar5 & 0x50051000) * 2 >> 1 |
                    iVar7 >> 0x11 & 0xc000U);
        local_70.multiplier_ = (double)&DAT_3ff0000000000000;
        bVar2 = units::precise_unit::operator==(&local_50,&local_70);
        local_a0.data_._0_1_ = (internal)!bVar2;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_a0.data_._0_1_) {
          testing::Message::Message((Message *)&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),
                     "Error with false comparison 1 index ",0x24);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,(internal *)&local_a0,(AssertionResult *)"cunit1 == cunit2",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x485,(char *)local_90);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_90 != (undefined1  [8])&local_80) {
            operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
          }
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_98,local_98);
        }
        local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(1.0 / local_70.multiplier_);
        uVar4 = units::detail::unit_data::inv(&local_70.base_units_);
        uVar5 = ~local_70.commodity_;
        if (local_70.commodity_ == 0) {
          uVar5 = 0;
        }
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar5,uVar4);
        local_90 = (undefined1  [8])local_58;
        bVar2 = units::precise_unit::operator==(&local_50,(precise_unit *)local_90);
        local_a0.data_._0_1_ = (internal)!bVar2;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_a0.data_._0_1_) {
          testing::Message::Message((Message *)&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),
                     "Error with false comparison 1 inv index ",0x28);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,(internal *)&local_a0,
                     (AssertionResult *)"cunit1 == cunit2.inv()","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x487,(char *)local_90);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_90 != (undefined1  [8])&local_80) {
            operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
          }
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_98,local_98);
        }
        bVar2 = units::precise_unit::operator==(&local_40,&local_70);
        local_a0.data_._0_1_ = (internal)!bVar2;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_a0.data_._0_1_) {
          testing::Message::Message((Message *)&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),
                     "Error with false inv comparison 2 index ",0x28);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,(internal *)&local_a0,
                     (AssertionResult *)"cunit1inv == cunit2","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x48a,(char *)local_90);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_90 != (undefined1  [8])&local_80) {
            operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
          }
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_98,local_98);
        }
        local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(1.0 / local_70.multiplier_);
        uVar4 = units::detail::unit_data::inv(&local_70.base_units_);
        uVar5 = ~local_70.commodity_;
        if (local_70.commodity_ == 0) {
          uVar5 = 0;
        }
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar5,uVar4);
        local_90 = (undefined1  [8])local_58;
        bVar2 = units::precise_unit::operator==(&local_40,(precise_unit *)local_90);
        local_a0.data_._0_1_ = (internal)!bVar2;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_a0.data_._0_1_) {
          testing::Message::Message((Message *)&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),
                     "Error with false inv comparison 2 inv index ",0x2c);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,(internal *)&local_a0,
                     (AssertionResult *)"cunit1inv == cunit2.inv()","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x48d,(char *)local_90);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_90 != (undefined1  [8])&local_80) {
            operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
          }
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_98,local_98);
        }
      }
      uVar8 = uVar8 + 1;
      iVar7 = iVar7 + 0x10000000;
    } while (uVar8 != 0x10);
    uVar5 = local_aa + 1;
    local_aa = (unsigned_short)uVar5;
  } while (local_aa < 0x10);
  return;
}

Assistant:

TEST(customCountUnits, uniqueness)
{
    for (std::uint16_t ii = 0; ii < 16; ++ii) {
        auto cunit1 = precise::generate_custom_count_unit(ii);
        auto cunit1inv = cunit1.inv();

        EXPECT_EQ(
            precise::custom::custom_count_unit_number(cunit1.base_units()), ii);
        EXPECT_EQ(
            precise::custom::custom_count_unit_number(cunit1.base_units()), ii);
        for (std::uint16_t jj = 0; jj < 16; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_count_unit(jj);
            EXPECT_FALSE(cunit1 == cunit2)
                << "Error with false comparison 1 index " << ii << "," << jj;
            EXPECT_FALSE(cunit1 == cunit2.inv())
                << "Error with false comparison 1 inv index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2)
                << "Error with false inv comparison 2 index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2.inv())
                << "Error with false inv comparison 2 inv index " << ii << ","
                << jj;
        }
    }
}